

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O1

void ncnn::qsort_descent_inplace<ncnn::BBoxRect>
               (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *datas,
               vector<float,_std::allocator<float>_> *scores,int left,int right)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  pointer pfVar5;
  pointer pBVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  int right_00;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  do {
    right_00 = right;
    iVar12 = left;
    if (left <= right) {
      fVar2 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[(right + left) / 2];
      do {
        pfVar5 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = (long)iVar12 + -1;
        lVar15 = (long)iVar12 * 5 + -5;
        iVar4 = iVar12;
        do {
          iVar12 = iVar4;
          lVar11 = lVar15;
          lVar10 = lVar13 + 1;
          lVar13 = lVar13 + 1;
          lVar15 = lVar11 + 5;
          iVar4 = iVar12 + 1;
        } while (fVar2 < pfVar5[lVar10]);
        lVar15 = (long)right_00 + 1;
        lVar10 = (long)right_00 * 5 + 5;
        iVar4 = right_00;
        do {
          right_00 = iVar4;
          lVar14 = lVar10;
          pfVar1 = pfVar5 + lVar15 + -1;
          lVar15 = lVar15 + -1;
          lVar10 = lVar14 + -5;
          iVar4 = right_00 + -1;
        } while (*pfVar1 <= fVar2 && fVar2 != *pfVar1);
        if (lVar13 <= lVar15) {
          pBVar6 = (datas->super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          iVar4 = (&pBVar6[1].label)[lVar11];
          uVar7 = *(undefined8 *)(&pBVar6[1].xmin + lVar11);
          uVar8 = *(undefined8 *)(&pBVar6[1].xmin + lVar11 + 2);
          (&pBVar6[1].label)[lVar11] = (&pBVar6[-1].label)[lVar14];
          uVar9 = *(undefined8 *)(&pBVar6[-1].xmin + lVar14 + 2);
          *(undefined8 *)(&pBVar6[1].xmin + lVar11) = *(undefined8 *)(&pBVar6[-1].xmin + lVar14);
          *(undefined8 *)(&pBVar6[1].xmin + lVar11 + 2) = uVar9;
          (&pBVar6[-1].label)[lVar14] = iVar4;
          *(undefined8 *)(&pBVar6[-1].xmin + lVar14) = uVar7;
          *(undefined8 *)(&pBVar6[-1].xmin + lVar14 + 2) = uVar8;
          pfVar5 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          fVar3 = pfVar5[lVar13];
          pfVar5[lVar13] = pfVar5[lVar15];
          pfVar5[lVar15] = fVar3;
          right_00 = right_00 + -1;
          iVar12 = iVar12 + 1;
        }
      } while (iVar12 <= right_00);
    }
    if (left < right_00) {
      qsort_descent_inplace<ncnn::BBoxRect>(datas,scores,left,right_00);
    }
    left = iVar12;
  } while (iVar12 < right);
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<T>& datas, std::vector<float>& scores, int left, int right)
{
    int i = left;
    int j = right;
    float p = scores[(left + right) / 2];

    while (i <= j)
    {
        while (scores[i] > p)
            i++;

        while (scores[j] < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(datas[i], datas[j]);
            std::swap(scores[i], scores[j]);

            i++;
            j--;
        }
    }

    if (left < j)
        qsort_descent_inplace(datas, scores, left, j);

    if (i < right)
        qsort_descent_inplace(datas, scores, i, right);
}